

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfRequestPub.c
# Opt level: O3

sbfRequestPub_conflict
sbfRequestPub_create
          (sbfTport tport,sbfQueue queue,char *topic,sbfRequestPubReadyCb readyCb,void *closure)

{
  uint uVar1;
  sbfRequestPub_conflict pub;
  undefined8 uVar2;
  sbfLog psVar3;
  char *pcVar4;
  sbfPub psVar5;
  sbfSub psVar6;
  char replyTopic [255];
  char requestTopic [255];
  char acStack_238 [256];
  char local_138 [264];
  
  uVar1 = snprintf(local_138,0xff,"%s@request",topic);
  if ((uVar1 < 0xff) && (uVar1 = snprintf(acStack_238,0xff,"%s@reply",topic), uVar1 < 0xff)) {
    pub = (sbfRequestPub_conflict)sbfMemory_calloc(1,0x68);
    uVar2 = sbfTport_getMw(tport);
    psVar3 = (sbfLog)sbfMw_getLog(uVar2);
    pub->mLog = psVar3;
    pcVar4 = (char *)sbfMemory_strdup(topic);
    pub->mTopic = pcVar4;
    sbfLog_log(pub->mLog,0,"creating request publisher %p: topic %s",pub,topic);
    pub->mReadyCb = readyCb;
    pub->mClosure = closure;
    sbfGuid_new(pub->mLog,&pub->mNext);
    (pub->mRequests).rbh_root = (sbfRequestImpl *)0x0;
    psVar5 = (sbfPub)sbfPub_create(tport,queue,local_138,sbfRequestPubPubReadyCb,pub);
    pub->mPub = psVar5;
    if (psVar5 != (sbfPub)0x0) {
      psVar6 = (sbfSub)sbfSub_create(tport,queue,acStack_238,sbfRequestPubSubReadyCb,
                                     sbfRequestPubSubMessageCb,pub);
      pub->mSub = psVar6;
      if (psVar6 != (sbfSub)0x0) {
        return pub;
      }
    }
    sbfRequestPub_destroy(pub);
  }
  return (sbfRequestPub_conflict)0x0;
}

Assistant:

sbfRequestPub
sbfRequestPub_create (sbfTport tport,
                      sbfQueue queue,
                      const char* topic,
                      sbfRequestPubReadyCb readyCb,
                      void* closure)
{
    sbfRequestPub pub;
    char          requestTopic[SBF_TOPIC_SIZE_LIMIT];
    char          replyTopic[SBF_TOPIC_SIZE_LIMIT];
    int           used;

    used = snprintf (requestTopic, sizeof requestTopic, "%s@request", topic);
    if (used < 0 || (size_t)used >= sizeof requestTopic)
        return NULL;
    used = snprintf (replyTopic, sizeof replyTopic, "%s@reply", topic);
    if (used < 0 || (size_t)used >= sizeof replyTopic)
        return NULL;

    pub = xcalloc (1, sizeof *pub);
    pub->mLog = sbfMw_getLog (sbfTport_getMw (tport));
    pub->mTopic = xstrdup (topic);

    sbfLog_debug (pub->mLog,
                  "creating request publisher %p: topic %s",
                  pub,
                  topic);

    pub->mReadyCb = readyCb;
    pub->mClosure = closure;

    sbfGuid_new (pub->mLog, &pub->mNext);
    RB_INIT (&pub->mRequests);

    pub->mPub = sbfPub_create (tport,
                               queue,
                               requestTopic,
                               sbfRequestPubPubReadyCb,
                               pub);
    if (pub->mPub == NULL)
        goto fail;

    pub->mSub = sbfSub_create (tport,
                               queue,
                               replyTopic,
                               sbfRequestPubSubReadyCb,
                               sbfRequestPubSubMessageCb,
                               pub);
    if (pub->mSub == NULL)
        goto fail;

    return pub;

fail:
    sbfRequestPub_destroy (pub);
    return NULL;
}